

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O2

void lzham::lzham_print_mem_stats(lzham_malloc_context context)

{
  if (context != (lzham_malloc_context)0x0) {
    return;
  }
  lzham_assert("context",
               "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_mem.cpp"
               ,0x1c1);
  return;
}

Assistant:

void lzham_print_mem_stats(lzham_malloc_context context)
   {
      LZHAM_VERIFY(context);

#if LZHAM_MEM_STATS
      malloc_context *pContext = static_cast<malloc_context *>(context);
      
      LZHAM_VERIFY(pContext->m_sig == malloc_context::cSig);

      printf("Current blocks: %u, allocated: %" LZHAM_PRIu64 ", max ever allocated: %" LZHAM_PRIi64 "\n", pContext->m_total_blocks, (int64)pContext->m_cur_allocated, (int64)pContext->m_max_allocated);
      printf("Max used arena: %u\n", pContext->m_arena_ofs);
      printf("Max blocks: %" LZHAM_PRIu64 "\n", pContext->m_max_blocks);
#endif
   }